

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

string * wasm::Path::getBinaryenBinaryTool(string *__return_storage_ptr__,string *name)

{
  long lVar1;
  long *plVar2;
  size_type *psVar3;
  long *local_40 [2];
  long local_30 [2];
  
  getBinaryenBinDir_abi_cxx11_();
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)local_40,(ulong)(name->_M_dataplus)._M_p)
  ;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar3) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getBinaryenBinaryTool(const std::string& name) {
  return getBinaryenBinDir() + name;
}